

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.h
# Opt level: O0

void __thiscall configFileReader::configFileReader(configFileReader *this,string *configFile)

{
  vector<char,_std::allocator<char>_> *this_00;
  value_type local_25 [13];
  string *local_18;
  string *configFile_local;
  configFileReader *this_local;
  
  local_18 = configFile;
  configFile_local = &this->fileName;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->text);
  this->index = 0;
  this->readFromString = false;
  this_00 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  *(undefined8 *)&(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl = 0;
  *(undefined8 *)&(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8 = 0;
  *(undefined8 *)&(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10 = 0;
  std::vector<char,_std::allocator<char>_>::vector(this_00);
  this->septarators = this_00;
  this->isOpen = false;
  std::__cxx11::string::string((string *)&this->commentToken);
  std::__cxx11::string::operator=((string *)this,(string *)configFile);
  std::__cxx11::string::operator=((string *)&this->text,"");
  local_25[0] = '\"';
  std::vector<char,_std::allocator<char>_>::push_back(this->septarators,local_25);
  return;
}

Assistant:

configFileReader(string configFile) {
        fileName = configFile;
        text = "";
        septarators->push_back('"');
    }